

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O3

Msat_Clause_t * Msat_SolverReadClause(Msat_Solver_t *p,int Num)

{
  int iVar1;
  Msat_Clause_t *pMVar2;
  int i;
  Msat_ClauseVec_t *p_00;
  
  if (Num < p->nClauses) {
    iVar1 = Msat_ClauseVecReadSize(p->vClauses);
    i = Num - iVar1;
    if (Num < iVar1) {
      p_00 = p->vClauses;
      i = Num;
    }
    else {
      p_00 = p->vLearned;
    }
    pMVar2 = Msat_ClauseVecReadEntry(p_00,i);
    return pMVar2;
  }
  __assert_fail("Num < p->nClauses",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverApi.c"
                ,0x56,"Msat_Clause_t *Msat_SolverReadClause(Msat_Solver_t *, int)");
}

Assistant:

Msat_Clause_t * Msat_SolverReadClause( Msat_Solver_t * p, int Num )
{
    int nClausesP;
    assert( Num < p->nClauses );
    nClausesP = Msat_ClauseVecReadSize( p->vClauses );
    if ( Num < nClausesP )
        return Msat_ClauseVecReadEntry( p->vClauses, Num );
    return Msat_ClauseVecReadEntry( p->vLearned, Num - nClausesP );
}